

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void start_pass_huff(j_compress_ptr cinfo,boolean gather_statistics)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  huff_entropy_ptr entropy;
  c_derived_tbl **in_stack_00000520;
  int in_stack_00000528;
  boolean in_stack_0000052c;
  j_compress_ptr in_stack_00000530;
  int local_1c;
  
  lVar2 = in_RDI[0x46];
  if (in_ESI == 0) {
    *(code **)(lVar2 + 0x10) = finish_pass_huff;
  }
  else {
    *(code **)(lVar2 + 0x10) = finish_pass_gather;
  }
  if ((int)in_RDI[0x2b] == 0) {
    if (in_ESI == 0) {
      *(code **)(lVar2 + 8) = encode_mcu_huff;
    }
    else {
      *(code **)(lVar2 + 8) = encode_mcu_gather;
    }
  }
  else {
    *(long **)(lVar2 + 0xd8) = in_RDI;
    *(int *)(lVar2 + 0xc0) = in_ESI;
    if (*(int *)((long)in_RDI + 0x1d4) == 0) {
      if (*(int *)((long)in_RDI + 0x1cc) == 0) {
        *(code **)(lVar2 + 8) = encode_mcu_DC_first;
      }
      else {
        *(code **)(lVar2 + 8) = encode_mcu_AC_first;
      }
    }
    else if (*(int *)((long)in_RDI + 0x1cc) == 0) {
      *(code **)(lVar2 + 8) = encode_mcu_DC_refine;
    }
    else {
      *(code **)(lVar2 + 8) = encode_mcu_AC_refine;
      if (*(long *)(lVar2 + 0xf0) == 0) {
        uVar4 = (**(code **)in_RDI[1])(in_RDI,1,1000);
        *(undefined8 *)(lVar2 + 0xf0) = uVar4;
      }
    }
    *(undefined4 *)(lVar2 + 0xe0) = *(undefined4 *)(in_RDI[0x2f] + 0x18);
    *(undefined4 *)(lVar2 + 0xe4) = 0;
    *(undefined4 *)(lVar2 + 0xe8) = 0;
  }
  for (local_1c = 0; local_1c < (int)in_RDI[0x2e]; local_1c = local_1c + 1) {
    lVar3 = in_RDI[(long)local_1c + 0x2f];
    if ((*(int *)((long)in_RDI + 0x1cc) == 0) && (*(int *)((long)in_RDI + 0x1d4) == 0)) {
      iVar1 = *(int *)(lVar3 + 0x14);
      if (in_ESI == 0) {
        jpeg_make_c_derived_tbl
                  (in_stack_00000530,in_stack_0000052c,in_stack_00000528,in_stack_00000520);
      }
      else {
        if ((iVar1 < 0) || (3 < iVar1)) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x34;
          *(int *)(*in_RDI + 0x2c) = iVar1;
          (**(code **)*in_RDI)(in_RDI);
        }
        if (*(long *)(lVar2 + 0x80 + (long)iVar1 * 8) == 0) {
          uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x808);
          *(undefined8 *)(lVar2 + 0x80 + (long)iVar1 * 8) = uVar4;
        }
        memset(*(void **)(lVar2 + 0x80 + (long)iVar1 * 8),0,0x808);
      }
      *(undefined4 *)(lVar2 + 0x24 + (long)local_1c * 4) = 0;
    }
    if ((int)in_RDI[0x3a] != 0) {
      iVar1 = *(int *)(lVar3 + 0x18);
      if (in_ESI == 0) {
        jpeg_make_c_derived_tbl
                  (in_stack_00000530,in_stack_0000052c,in_stack_00000528,in_stack_00000520);
      }
      else {
        if ((iVar1 < 0) || (3 < iVar1)) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x34;
          *(int *)(*in_RDI + 0x2c) = iVar1;
          (**(code **)*in_RDI)(in_RDI);
        }
        if (*(long *)(lVar2 + 0xa0 + (long)iVar1 * 8) == 0) {
          uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x808);
          *(undefined8 *)(lVar2 + 0xa0 + (long)iVar1 * 8) = uVar4;
        }
        memset(*(void **)(lVar2 + 0xa0 + (long)iVar1 * 8),0,0x808);
      }
    }
  }
  *(undefined8 *)(lVar2 + 0x18) = 0;
  *(undefined4 *)(lVar2 + 0x20) = 0;
  *(undefined4 *)(lVar2 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
  *(undefined4 *)(lVar2 + 0x3c) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff (j_compress_ptr cinfo, boolean gather_statistics)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    entropy->pub.finish_pass = finish_pass_gather;
  else
    entropy->pub.finish_pass = finish_pass_huff;

  if (cinfo->progressive_mode) {
    entropy->cinfo = cinfo;
    entropy->gather_statistics = gather_statistics;

    /* We assume jcmaster.c already validated the scan parameters. */

    /* Select execution routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else {
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
	/* AC refinement needs a correction bit buffer */
	if (entropy->bit_buffer == NULL)
	  entropy->bit_buffer = (char *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					MAX_CORR_BITS * SIZEOF(char));
      }
    }

    /* Initialize AC stuff */
    entropy->ac_tbl_no = cinfo->cur_comp_info[0]->ac_tbl_no;
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  } else {
    if (gather_statistics)
      entropy->pub.encode_mcu = encode_mcu_gather;
    else
      entropy->pub.encode_mcu = encode_mcu_huff;
  }

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (gather_statistics) {
	/* Check for invalid table index */
	/* (make_c_derived_tbl does this in the other path) */
	if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
	  ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
	/* Allocate and zero the statistics tables */
	/* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
	if (entropy->dc_count_ptrs[tbl] == NULL)
	  entropy->dc_count_ptrs[tbl] = (long *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					257 * SIZEOF(long));
	MEMZERO(entropy->dc_count_ptrs[tbl], 257 * SIZEOF(long));
      } else {
	/* Compute derived values for Huffman tables */
	/* We may do this more than once for a table, but it's not expensive */
	jpeg_make_c_derived_tbl(cinfo, TRUE, tbl,
				& entropy->dc_derived_tbls[tbl]);
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (gather_statistics) {
	if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
	  ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
	if (entropy->ac_count_ptrs[tbl] == NULL)
	  entropy->ac_count_ptrs[tbl] = (long *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					257 * SIZEOF(long));
	MEMZERO(entropy->ac_count_ptrs[tbl], 257 * SIZEOF(long));
      } else {
	jpeg_make_c_derived_tbl(cinfo, FALSE, tbl,
				& entropy->ac_derived_tbls[tbl]);
      }
    }
  }

  /* Initialize bit buffer to empty */
  entropy->saved.put_buffer = 0;
  entropy->saved.put_bits = 0;

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}